

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,Matrix<float,__1,__1,_0,__1,__1> *src,
               assign_op<float,_float> *func)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  
  pfVar3 = (src->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  uVar8 = (src->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar10 = (src->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar8) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      uVar10)) {
    if ((long)(uVar10 | uVar8) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    if ((uVar10 != 0 && uVar8 != 0) &&
       (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar6 / SEXT816((long)uVar10),0) < (long)uVar8)) {
      puVar9 = (undefined8 *)
               __cxa_allocate_exception(8,src,SUB168(auVar6 % SEXT816((long)uVar10),0));
      *puVar9 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<float,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<float,__1,__1,__1,_0> *)dst,uVar10 * uVar8,uVar8,uVar10);
  }
  uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar4 == uVar8) &&
     (uVar8 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar8 == uVar10)) {
    pfVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    uVar8 = uVar8 * uVar4;
    uVar10 = uVar8 + 3;
    if (-1 < (long)uVar8) {
      uVar10 = uVar8;
    }
    uVar10 = uVar10 & 0xfffffffffffffffc;
    if (3 < (long)uVar8) {
      lVar11 = 0;
      do {
        pfVar1 = pfVar3 + lVar11;
        uVar7 = *(undefined8 *)(pfVar1 + 2);
        pfVar2 = pfVar5 + lVar11;
        *(undefined8 *)pfVar2 = *(undefined8 *)pfVar1;
        *(undefined8 *)(pfVar2 + 2) = uVar7;
        lVar11 = lVar11 + 4;
      } while (lVar11 < (long)uVar10);
    }
    if ((long)uVar10 < (long)uVar8) {
      do {
        pfVar5[uVar10] = pfVar3[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar8 - uVar10 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Matrix<float, -1, -1>, T1 = float, T2 = float]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}